

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O1

uint32_t helper_uqsub8_arm(uint32_t a,uint32_t b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  
  uVar2 = (uint)(byte)((byte)a - (byte)b);
  if ((byte)a < (byte)b) {
    uVar2 = 0;
  }
  bVar4 = (byte)(a >> 8);
  bVar5 = (byte)(b >> 8);
  uVar6 = (uint)(byte)(bVar4 - bVar5);
  if (bVar4 < bVar5) {
    uVar6 = 0;
  }
  bVar4 = (byte)(a >> 0x10);
  bVar5 = (byte)(b >> 0x10);
  uVar3 = (uint)(byte)(bVar4 - bVar5);
  if (bVar4 < bVar5) {
    uVar3 = 0;
  }
  bVar4 = (byte)(b >> 0x18);
  bVar5 = (byte)(a >> 0x18);
  uVar1 = (uint)(byte)(bVar5 - bVar4);
  if (bVar5 < bVar4) {
    uVar1 = 0;
  }
  return uVar1 << 0x18 | uVar3 << 0x10 | uVar6 << 8 | uVar2;
}

Assistant:

uint32_t HELPER(glue(PFX,sub8))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB8(a, b, 0);
    SUB8(a >> 8, b >> 8, 1);
    SUB8(a >> 16, b >> 16, 2);
    SUB8(a >> 24, b >> 24, 3);
    SET_GE;
    return res;
}